

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CThumbInstruction.cpp
# Opt level: O3

void __thiscall CThumbInstruction::writeTempData(CThumbInstruction *this,TempData *tempData)

{
  int64_t memoryAddress;
  uint uVar1;
  size_t sVar2;
  char str [256];
  string local_148;
  char local_128 [256];
  
  uVar1 = sprintf(local_128,"   %s",(this->Opcode).name);
  if ((int)uVar1 < 0xb) {
    memset(local_128 + (int)uVar1,0x20,(ulong)(10 - uVar1) + 1);
    uVar1 = 0xb;
  }
  local_128[uVar1] = '\0';
  memoryAddress = this->RamPos;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  sVar2 = strlen(local_128);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,local_128,local_128 + sVar2);
  TempData::writeLine(tempData,memoryAddress,&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CThumbInstruction::writeTempData(TempData& tempData) const
{
	char str[256];

	int pos = sprintf(str,"   %s",Opcode.name);
	while (pos < 11) str[pos++] = ' ';
	str[pos] = 0;
	FormatInstruction(Opcode.mask,&str[pos]);

	tempData.writeLine(RamPos,str);
}